

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_lowbit8(uint n)

{
  int k;
  uint n_local;
  
  k = (int)stb_lowbit8::lowbit4[n & 0xf];
  if ((k < 0) && (k = (int)stb_lowbit8::lowbit4[n >> 4 & 0xf], -1 < k)) {
    k = k + 4;
  }
  return k;
}

Assistant:

int stb_lowbit8(unsigned int n)
{
   static signed char lowbit4[16] = { -1,0,1,0, 2,0,1,0, 3,0,1,0, 2,0,1,0 };
   int k = lowbit4[n & 15];
   if (k >= 0) return k;
   k = lowbit4[(n >> 4) & 15];
   if (k >= 0) return k+4;
   return k;
}